

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.cpp
# Opt level: O2

void s_recv_padding(socket_t *socket,string_view trace)

{
  runtime_error *this;
  allocator<char> local_89;
  string_view trace_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> resp;
  
  trace_local._M_str = trace._M_str;
  trace_local._M_len = trace._M_len;
  s_recv<std::__cxx11::string>(&resp,socket,trace);
  if (resp._M_string_length == 0) {
    std::__cxx11::string::~string((string *)&resp);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_78,&trace_local,&local_89);
  std::operator+(&local_58,"Expected zero-sized frame:",&local_78);
  std::runtime_error::runtime_error(this,(string *)&local_58);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void s_recv_padding(zmq::socket_t *socket, std::string_view trace) {
    auto resp{s_recv<std::string>(socket, trace)};
    if (!resp.empty()) {
        throw std::runtime_error("Expected zero-sized frame:" +
                                 std::string(trace));
    }
}